

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

resizable_tensor * __thiscall
dlib::resizable_tensor::operator=
          (resizable_tensor *this,
          matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
          *item)

{
  if (((this->super_tensor).m_n != *(long *)(**(long **)item + 8)) ||
     ((this->super_tensor).m_nr * (this->super_tensor).m_k * (this->super_tensor).m_nc != 1)) {
    set_size(this,*(long *)(**(long **)item + 8),1,1,1);
  }
  tensor::operator=(&this->super_tensor,item);
  return this;
}

Assistant:

resizable_tensor& operator= (
            const matrix_exp<EXP>& item
        )
        {
            if (!(num_samples() == item.nr() && k()*nr()*nc() == item.nc()))
                set_size(item.nr(), item.nc());
            tensor::operator=(item);
            return *this;
        }